

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3GenerateRowIndexDelete
               (Parse *pParse,Table *pTab,int iDataCur,int iIdxCur,int *aRegIdx,int iIdxNoSeek)

{
  Index *pIdx;
  Parse *pParse_00;
  int regPrior;
  Index *pIVar1;
  Index *pPrior;
  Index **ppIVar2;
  int *piVar3;
  int iPartIdxLabel;
  Index *local_48;
  Vdbe *local_40;
  Parse *local_38;
  
  local_40 = pParse->pVdbe;
  local_38 = pParse;
  if ((pTab->tabFlags & 0x20) == 0) {
    pIVar1 = (Index *)0x0;
  }
  else {
    pIVar1 = sqlite3PrimaryKeyIndex(pTab);
  }
  pParse_00 = local_38;
  ppIVar2 = &pTab->pIndex;
  regPrior = -1;
  pPrior = (Index *)0x0;
  piVar3 = aRegIdx;
  local_48 = pIVar1;
  do {
    pIdx = *ppIVar2;
    if (pIdx == (Index *)0x0) {
      return;
    }
    if (aRegIdx == (int *)0x0) {
      if (pIdx != pIVar1) goto LAB_001913b0;
    }
    else if (pIdx != pIVar1 && *piVar3 != 0) {
LAB_001913b0:
      if (iIdxNoSeek != iIdxCur) {
        regPrior = sqlite3GenerateIndexKey
                             (pParse_00,pIdx,iDataCur,0,1,&iPartIdxLabel,pPrior,regPrior);
        sqlite3VdbeAddOp3(local_40,0x85,iIdxCur,regPrior,
                          (uint)(&pIdx->nKeyCol)[(*(ushort *)&pIdx->field_0x63 & 8) == 0]);
        sqlite3ResolvePartIdxLabel(pParse_00,iPartIdxLabel);
        pIVar1 = local_48;
        pPrior = pIdx;
      }
    }
    ppIVar2 = &pIdx->pNext;
    iIdxCur = iIdxCur + 1;
    piVar3 = piVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3GenerateRowIndexDelete(
  Parse *pParse,     /* Parsing and code generating context */
  Table *pTab,       /* Table containing the row to be deleted */
  int iDataCur,      /* Cursor of table holding data. */
  int iIdxCur,       /* First index cursor */
  int *aRegIdx,      /* Only delete if aRegIdx!=0 && aRegIdx[i]>0 */
  int iIdxNoSeek     /* Do not delete from this cursor */
){
  int i;             /* Index loop counter */
  int r1 = -1;       /* Register holding an index key */
  int iPartIdxLabel; /* Jump destination for skipping partial index entries */
  Index *pIdx;       /* Current index */
  Index *pPrior = 0; /* Prior index */
  Vdbe *v;           /* The prepared statement under construction */
  Index *pPk;        /* PRIMARY KEY index, or NULL for rowid tables */

  v = pParse->pVdbe;
  pPk = HasRowid(pTab) ? 0 : sqlite3PrimaryKeyIndex(pTab);
  for(i=0, pIdx=pTab->pIndex; pIdx; i++, pIdx=pIdx->pNext){
    assert( iIdxCur+i!=iDataCur || pPk==pIdx );
    if( aRegIdx!=0 && aRegIdx[i]==0 ) continue;
    if( pIdx==pPk ) continue;
    if( iIdxCur+i==iIdxNoSeek ) continue;
    VdbeModuleComment((v, "GenRowIdxDel for %s", pIdx->zName));
    r1 = sqlite3GenerateIndexKey(pParse, pIdx, iDataCur, 0, 1,
        &iPartIdxLabel, pPrior, r1);
    sqlite3VdbeAddOp3(v, OP_IdxDelete, iIdxCur+i, r1,
        pIdx->uniqNotNull ? pIdx->nKeyCol : pIdx->nColumn);
    sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
    pPrior = pIdx;
  }
}